

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynModule * Parse(ParseContext *ctx,char *code,char *moduleRoot)

{
  Lexer *this;
  uint uVar1;
  int iVar2;
  Lexeme *pLVar3;
  SynModule *pSVar4;
  TraceScope traceScope;
  TraceScope local_30;
  
  if (Parse(ParseContext&,char_const*,char_const*)::token == '\0') {
    iVar2 = __cxa_guard_acquire(&Parse(ParseContext&,char_const*,char_const*)::token);
    if (iVar2 != 0) {
      Parse::token = NULLC::TraceGetToken("parser","Parse");
      __cxa_guard_release(&Parse(ParseContext&,char_const*,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_30,Parse::token);
  ctx->code = code;
  ctx->moduleRoot = moduleRoot;
  uVar1 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar1;
  (ctx->statistics).finishTime = 0;
  this = &ctx->lexer;
  Lexer::Lexify(this,code);
  uVar1 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Lexer",uVar1);
  uVar1 = *(uint *)(NULLC::traceContext + 0x244);
  iVar2 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
  if (iVar2 == 0) {
    uVar1 = Lexer::GetStreamSize(this);
    if (uVar1 == 0) {
      __assert_fail("ctx.lexer.GetStreamSize() != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0xc8a,"SynModule *Parse(ParseContext &, const char *, const char *)");
    }
    ctx->errorHandlerActive = true;
    pLVar3 = Lexer::GetStreamStart(this);
    ctx->firstLexeme = pLVar3;
    pLVar3 = Lexer::GetStreamStart(this);
    ctx->currentLexeme = pLVar3;
    pLVar3 = Lexer::GetStreamStart(this);
    uVar1 = Lexer::GetStreamSize(this);
    ctx->lastLexeme = pLVar3 + (uVar1 - 1);
    pSVar4 = ParseModule(ctx);
    ctx->errorHandlerActive = false;
  }
  else {
    NULLC::TraceLeaveTo(uVar1);
    if (ctx->errorPos == (char *)0x0) {
      __assert_fail("ctx.errorPos",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0xc9f,"SynModule *Parse(ParseContext &, const char *, const char *)");
    }
    pSVar4 = (SynModule *)0x0;
  }
  ctx->code = (char *)0x0;
  ctx->moduleRoot = (char *)0x0;
  NULLC::TraceScope::~TraceScope(&local_30);
  return pSVar4;
}

Assistant:

SynModule* Parse(ParseContext &ctx, const char *code, const char *moduleRoot)
{
	TRACE_SCOPE("parser", "Parse");

	ctx.code = code;

	ctx.moduleRoot = moduleRoot;

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.lexer.Lexify(code);

	ctx.statistics.Finish("Lexer", NULLCTime::clockMicro());

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		assert(ctx.lexer.GetStreamSize() != 0);

		ctx.errorHandlerActive = true;

		ctx.firstLexeme = ctx.lexer.GetStreamStart();
		ctx.currentLexeme = ctx.lexer.GetStreamStart();
		ctx.lastLexeme = ctx.lexer.GetStreamStart() + (ctx.lexer.GetStreamSize() - 1);

		SynModule *module = ParseModule(ctx);

		ctx.errorHandlerActive = false;

		ctx.code = NULL;

		ctx.moduleRoot = NULL;

		return module;
	}

	NULLC::TraceLeaveTo(traceDepth);

	assert(ctx.errorPos);

	ctx.code = NULL;

	ctx.moduleRoot = NULL;

	return NULL;
}